

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

AsmJsScriptFunction * __thiscall
Js::JavascriptLibrary::CreateAsmJsScriptFunction(JavascriptLibrary *this,FunctionProxy *proxy)

{
  code *pcVar1;
  bool bVar2;
  FunctionInfo *pFVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  JavascriptLibrary *pJVar6;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_81;
  TrackAllocData local_80;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_51;
  TrackAllocData local_50;
  ScriptFunctionType *local_28;
  ScriptFunctionType *deferredPrototypeType;
  FunctionProxy *proxy_local;
  JavascriptLibrary *this_local;
  
  deferredPrototypeType = (ScriptFunctionType *)proxy;
  proxy_local = (FunctionProxy *)this;
  local_28 = FunctionProxy::EnsureDeferredPrototypeType(proxy);
  pFVar3 = FunctionProxy::GetFunctionInfo((FunctionProxy *)deferredPrototypeType);
  bVar2 = FunctionInfo::HasHomeObj(pFVar3);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x18f8,"(!proxy->GetFunctionInfo()->HasHomeObj())",
                                "!proxy->GetFunctionInfo()->HasHomeObj()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pFVar3 = FunctionProxy::GetFunctionInfo((FunctionProxy *)deferredPrototypeType);
  bVar2 = FunctionInfo::HasComputedName(pFVar3);
  if (bVar2) {
    pRVar5 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&FunctionWithComputedName<Js::AsmJsScriptFunction>::typeinfo,0
               ,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x18fb);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_50);
    pJVar6 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)1>(0x58,pRVar5,&local_51);
    FunctionWithComputedName<Js::AsmJsScriptFunction>::FunctionWithComputedName
              ((FunctionWithComputedName<Js::AsmJsScriptFunction> *)pJVar6,
               (FunctionProxy *)deferredPrototypeType,local_28);
    this_local = pJVar6;
  }
  else {
    pRVar5 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_80,(type_info *)&AsmJsScriptFunction::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
               ,0x18fd);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_80);
    pJVar6 = (JavascriptLibrary *)new<(Memory::ObjectInfoBits)1>(0x50,pRVar5,&local_81);
    AsmJsScriptFunction::AsmJsScriptFunction
              ((AsmJsScriptFunction *)pJVar6,(FunctionProxy *)deferredPrototypeType,local_28);
    this_local = pJVar6;
  }
  return (AsmJsScriptFunction *)this_local;
}

Assistant:

AsmJsScriptFunction* JavascriptLibrary::CreateAsmJsScriptFunction(FunctionProxy * proxy)
    {
        ScriptFunctionType* deferredPrototypeType = proxy->EnsureDeferredPrototypeType();
        Assert(!proxy->GetFunctionInfo()->HasHomeObj());
        if (proxy->GetFunctionInfo()->HasComputedName())
        {
            return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, AsmJsScriptFunctionWithComputedName, proxy, deferredPrototypeType);
        }
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, AsmJsScriptFunction, proxy, deferredPrototypeType);
    }